

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntVect.H
# Opt level: O1

void __thiscall amrex::TagBoxArray::buffer(TagBoxArray *this,IntVect *nbuf)

{
  int iVar1;
  int *piVar2;
  MFIter mfi;
  MFIter MStack_88;
  
  iVar1 = nbuf->vect[1];
  if (nbuf->vect[1] < nbuf->vect[0]) {
    iVar1 = nbuf->vect[0];
  }
  if (iVar1 <= nbuf->vect[2]) {
    iVar1 = nbuf->vect[2];
  }
  if (0 < iVar1) {
    MFIter::MFIter(&MStack_88,(FabArrayBase *)this,'\0');
    if (MStack_88.currentIndex < MStack_88.endIndex) {
      do {
        piVar2 = &MStack_88.currentIndex;
        if (MStack_88.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar2 = ((MStack_88.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + MStack_88.currentIndex;
        }
        TagBox::buffer((this->super_FabArray<amrex::TagBox>).m_fabs_v.
                       super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl
                       .super__Vector_impl_data._M_start[*piVar2],nbuf,
                       &(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow);
        MFIter::operator++(&MStack_88);
      } while (MStack_88.currentIndex < MStack_88.endIndex);
    }
    MFIter::~MFIter(&MStack_88);
  }
  return;
}

Assistant:

int max () const noexcept
    {
#if (AMREX_SPACEDIM == 1)
        return vect[0];
#elif (AMREX_SPACEDIM == 2)
        return (vect[0] > vect[1] ? vect[0] : vect[1]);
#else
        int r = vect[0] > vect[1] ? vect[0] : vect[1];
        return (r > vect[2]) ? r : vect[2];
#endif
    }